

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bamtools_split.cpp
# Opt level: O0

bool __thiscall BamTools::SplitTool::SplitToolPrivate::SplitTag(SplitToolPrivate *this)

{
  bool bVar1;
  ostream *this_00;
  char arrayTagType;
  char tagType;
  BamAlignment al;
  BamAlignment *in_stack_fffffffffffffe28;
  BamAlignment *in_stack_fffffffffffffe30;
  undefined6 in_stack_fffffffffffffe70;
  undefined1 in_stack_fffffffffffffe76;
  undefined1 in_stack_fffffffffffffe77;
  char *in_stack_fffffffffffffed8;
  string *in_stack_fffffffffffffee0;
  BamAlignment *in_stack_fffffffffffffee8;
  bool local_1;
  
  BamAlignment::BamAlignment
            ((BamAlignment *)
             CONCAT17(in_stack_fffffffffffffe77,
                      CONCAT16(in_stack_fffffffffffffe76,in_stack_fffffffffffffe70)));
  do {
    bVar1 = BamReader::GetNextAlignment
                      ((BamReader *)in_stack_fffffffffffffe30,in_stack_fffffffffffffe28);
    if (!bVar1) {
      local_1 = true;
      goto LAB_00169af9;
    }
    bVar1 = BamAlignment::GetTagType
                      (in_stack_fffffffffffffee8,in_stack_fffffffffffffee0,in_stack_fffffffffffffed8
                      );
  } while (!bVar1);
  in_stack_fffffffffffffe30 =
       (BamAlignment *)
       std::operator<<((ostream *)&std::cerr,"bamtools split ERROR: unknown tag type encountered: ")
  ;
  this_00 = std::operator<<((ostream *)in_stack_fffffffffffffe30,'\0');
  std::ostream::operator<<(this_00,std::endl<char,std::char_traits<char>>);
  local_1 = false;
LAB_00169af9:
  BamAlignment::~BamAlignment(in_stack_fffffffffffffe30);
  return local_1;
}

Assistant:

bool SplitTool::SplitToolPrivate::SplitTag()
{

    // iterate through alignments, until we hit TAG
    BamAlignment al;
    while (m_reader.GetNextAlignment(al)) {

        // look for tag in this alignment and get tag type
        char tagType(0);
        if (!al.GetTagType(m_settings->TagToSplit, tagType)) {
            continue;
        }

        // request split method based on tag type
        // pass it the current alignment found
        switch (tagType) {

            case (Constants::BAM_TAG_TYPE_INT8):
                return SplitTagImpl<int8_t>(al);
            case (Constants::BAM_TAG_TYPE_INT16):
                return SplitTagImpl<int16_t>(al);
            case (Constants::BAM_TAG_TYPE_INT32):
                return SplitTagImpl<int32_t>(al);
            case (Constants::BAM_TAG_TYPE_UINT8):
                return SplitTagImpl<uint8_t>(al);
            case (Constants::BAM_TAG_TYPE_UINT16):
                return SplitTagImpl<uint16_t>(al);
            case (Constants::BAM_TAG_TYPE_UINT32):
                return SplitTagImpl<uint32_t>(al);
            case (Constants::BAM_TAG_TYPE_FLOAT):
                return SplitTagImpl<float>(al);

            case (Constants::BAM_TAG_TYPE_ASCII):
            case (Constants::BAM_TAG_TYPE_STRING):
            case (Constants::BAM_TAG_TYPE_HEX):
                return SplitTagImpl<std::string>(al);

            case (Constants::BAM_TAG_TYPE_ARRAY): {

                char arrayTagType(0);
                if (!al.GetArrayTagType(m_settings->TagToSplit, arrayTagType)) {
                    continue;
                }
                switch (arrayTagType) {
                    case (Constants::BAM_TAG_TYPE_INT8):
                        return SplitListTagImpl<int8_t>(al);
                    case (Constants::BAM_TAG_TYPE_INT16):
                        return SplitListTagImpl<int16_t>(al);
                    case (Constants::BAM_TAG_TYPE_INT32):
                        return SplitListTagImpl<int32_t>(al);
                    case (Constants::BAM_TAG_TYPE_UINT8):
                        return SplitListTagImpl<uint8_t>(al);
                    case (Constants::BAM_TAG_TYPE_UINT16):
                        return SplitListTagImpl<uint16_t>(al);
                    case (Constants::BAM_TAG_TYPE_UINT32):
                        return SplitListTagImpl<uint32_t>(al);
                    case (Constants::BAM_TAG_TYPE_FLOAT):
                        return SplitListTagImpl<float>(al);
                    default:
                        std::cerr
                            << "bamtools split ERROR: array tag has unsupported element type: "
                            << arrayTagType << std::endl;
                        return false;
                }
            }

            default:
                std::cerr << "bamtools split ERROR: unknown tag type encountered: " << tagType
                          << std::endl;
                return false;
        }
    }

    // tag not found, but that's not an error - return success
    return true;
}